

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Wrapper * get_undos_search_dialog_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object undo_handler;
  Am_Object search_window;
  Am_Object *self_local;
  
  Am_Object::Am_Object(&undo_handler);
  Am_Object::Am_Object(&local_28,self);
  get_undo_handler(&local_20);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    in_value = Am_Object::Peek(&local_20,Am_SEARCH_DIALOG,0);
    Am_Object::operator=(&undo_handler,in_value);
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&undo_handler);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&undo_handler);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(get_undos_search_dialog)
{
  Am_Object search_window;
  Am_Object undo_handler = get_undo_handler(self);
  if (undo_handler.Valid()) {
    search_window = undo_handler.Peek(Am_SEARCH_DIALOG);
  }
  return search_window;
}